

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * xmlHashQLookup3(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  _xmlHashEntry *p_Var5;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    pbVar3 = prefix;
    if (prefix == (xmlChar *)0x0) {
      pbVar3 = name;
    }
    uVar2 = (ulong)*pbVar3 * 0x20 + (ulong)*pbVar3 * -2 + (long)table->random_seed;
    if (prefix != (xmlChar *)0x0) {
      bVar4 = *prefix;
      if (bVar4 != 0) {
        pbVar3 = prefix + 1;
        do {
          uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while (bVar4 != 0);
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    bVar4 = *name;
    if (bVar4 != 0) {
      pbVar3 = name + 1;
      do {
        uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
        bVar4 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar4 != 0);
    }
    uVar2 = (uVar2 >> 3) + uVar2 * 0x20 ^ uVar2;
    if (prefix2 != (xmlChar *)0x0) {
      bVar4 = *prefix2;
      if (bVar4 != 0) {
        pbVar3 = prefix2 + 1;
        do {
          uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while (bVar4 != 0);
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    if ((name2 != (xmlChar *)0x0) && (bVar4 = *name2, bVar4 != 0)) {
      pbVar3 = name2 + 1;
      do {
        uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
        bVar4 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar4 != 0);
    }
    uVar2 = (uVar2 >> 3) + uVar2 * 0x20 ^ uVar2;
    if (prefix3 != (xmlChar *)0x0) {
      bVar4 = *prefix3;
      if (bVar4 != 0) {
        pbVar3 = prefix3 + 1;
        do {
          uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while (bVar4 != 0);
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    if (name3 != (xmlChar *)0x0) {
      bVar4 = *name3;
      pbVar3 = name3;
      while (bVar4 != 0) {
        pbVar3 = pbVar3 + 1;
        uVar2 = uVar2 ^ (uVar2 >> 3) + (ulong)bVar4 + uVar2 * 0x20;
        bVar4 = *pbVar3;
      }
    }
    uVar2 = uVar2 % (ulong)(long)table->size;
    p_Var5 = table->table;
    if (p_Var5 == (_xmlHashEntry *)0x0 || p_Var5[uVar2].valid == 0) {
      return (void *)0x0;
    }
    p_Var5 = p_Var5 + uVar2;
    do {
      iVar1 = xmlStrQEqual(prefix,name,p_Var5->name);
      if (((iVar1 != 0) && (iVar1 = xmlStrQEqual(prefix2,name2,p_Var5->name2), iVar1 != 0)) &&
         (iVar1 = xmlStrQEqual(prefix3,name3,p_Var5->name3), iVar1 != 0)) {
        return p_Var5->payload;
      }
      p_Var5 = p_Var5->next;
    } while (p_Var5 != (_xmlHashEntry *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashQLookup3(xmlHashTablePtr table,
                const xmlChar *prefix, const xmlChar *name,
		const xmlChar *prefix2, const xmlChar *name2,
		const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeQKey(table, prefix, name, prefix2,
                             name2, prefix3, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrQEqual(prefix, name, entry->name)) &&
	    (xmlStrQEqual(prefix2, name2, entry->name2)) &&
	    (xmlStrQEqual(prefix3, name3, entry->name3)))
	    return(entry->payload);
    }
    return(NULL);
}